

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecfactory.cpp
# Opt level: O2

void __thiscall FastPForLib::CODECFactory::CODECFactory(CODECFactory *this)

{
  _Rb_tree_header *p_Var1;
  __shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *p_Var2;
  allocator local_39;
  _Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false> local_38;
  key_type local_30;
  
  p_Var1 = &(this->scodecmap)._M_t._M_impl.super__Rb_tree_header;
  (this->scodecmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->scodecmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->scodecmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->scodecmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->scodecmap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fastbinarypacking8_codec();
  std::__cxx11::string::string((string *)&local_30,"fastbinarypacking8",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  fastbinarypacking16_codec();
  std::__cxx11::string::string((string *)&local_30,"fastbinarypacking16",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  fastbinarypacking32_codec();
  std::__cxx11::string::string((string *)&local_30,"fastbinarypacking32",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  BP32_codec();
  std::__cxx11::string::string((string *)&local_30,"BP32",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  vsencoding_codec();
  std::__cxx11::string::string((string *)&local_30,"vsencoding",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  fastpfor128_codec();
  std::__cxx11::string::string((string *)&local_30,"fastpfor128",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  fastpfor256_codec();
  std::__cxx11::string::string((string *)&local_30,"fastpfor256",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdfastpfor128_codec();
  std::__cxx11::string::string((string *)&local_30,"simdfastpfor128",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdfastpfor256_codec();
  std::__cxx11::string::string((string *)&local_30,"simdfastpfor256",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simplepfor_codec();
  std::__cxx11::string::string((string *)&local_30,"simplepfor",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdsimplepfor_codec();
  std::__cxx11::string::string((string *)&local_30,"simdsimplepfor",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  pfor_codec();
  std::__cxx11::string::string((string *)&local_30,"pfor",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdpfor_codec();
  std::__cxx11::string::string((string *)&local_30,"simdpfor",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  pfor2008_codec();
  std::__cxx11::string::string((string *)&local_30,"pfor2008",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdnewpfor_codec();
  std::__cxx11::string::string((string *)&local_30,"simdnewpfor",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  newpfor_codec();
  std::__cxx11::string::string((string *)&local_30,"newpfor",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  optpfor_codec();
  std::__cxx11::string::string((string *)&local_30,"optpfor",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdoptpfor_codec();
  std::__cxx11::string::string((string *)&local_30,"simdoptpfor",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  varint_codec();
  std::__cxx11::string::string((string *)&local_30,"varint",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  vbyte_codec();
  std::__cxx11::string::string((string *)&local_30,"vbyte",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  maskedvbyte_codec();
  std::__cxx11::string::string((string *)&local_30,"maskedvbyte",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  streamvbyte_codec();
  std::__cxx11::string::string((string *)&local_30,"streamvbyte",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  varintgb_codec();
  std::__cxx11::string::string((string *)&local_30,"varintgb",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simple16_codec();
  std::__cxx11::string::string((string *)&local_30,"simple16",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simple9_codec();
  std::__cxx11::string::string((string *)&local_30,"simple9",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simple9_rle_codec();
  std::__cxx11::string::string((string *)&local_30,"simple9_rle",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simple8b_codec();
  std::__cxx11::string::string((string *)&local_30,"simple8b",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simple8b_rle_codec();
  std::__cxx11::string::string((string *)&local_30,"simple8b_rle",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  varintg8iu_codec();
  std::__cxx11::string::string((string *)&local_30,"varintg8iu",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdbinarypacking_codec();
  std::__cxx11::string::string((string *)&local_30,"simdbinarypacking",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdgroupsimple_codec();
  std::__cxx11::string::string((string *)&local_30,"simdgroupsimple",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdgroupsimple_ringbuf_codec();
  std::__cxx11::string::string((string *)&local_30,"simdgroupsimple_ringbuf",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  copy_codec();
  std::__cxx11::string::string((string *)&local_30,"copy",&local_39);
  p_Var2 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_30);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (local_38._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_38._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  return;
}

Assistant:

CODECFactory::CODECFactory() : scodecmap(initializefactory()) {}